

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_truncate(Pager *pPager,Pgno nPage)

{
  int iVar1;
  sqlite3_file *psVar2;
  char *__s;
  int iVar3;
  long lVar4;
  size_t __n;
  i64 currentSize;
  long local_30;
  
  psVar2 = pPager->fd;
  iVar3 = 0;
  if ((psVar2->pMethods != (sqlite3_io_methods *)0x0) &&
     (iVar3 = 0, (byte)(pPager->eState - 4) < 0xfd)) {
    iVar1 = pPager->pageSize;
    __n = (size_t)iVar1;
    iVar3 = (*psVar2->pMethods->xFileSize)(psVar2,&local_30);
    if (iVar3 == 0) {
      lVar4 = nPage * __n;
      iVar3 = 0;
      if (local_30 != lVar4) {
        if (lVar4 < local_30) {
          iVar3 = (*pPager->fd->pMethods->xTruncate)(pPager->fd,lVar4);
        }
        else {
          iVar3 = 0;
          if ((long)(local_30 + __n) <= lVar4) {
            __s = pPager->pTmpSpace;
            memset(__s,0,__n);
            iVar3 = (*pPager->fd->pMethods->xWrite)(pPager->fd,__s,iVar1,lVar4 - __n);
          }
        }
        if (iVar3 == 0) {
          pPager->dbFileSize = nPage;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );
  
  if( isOpen(pPager->fd) 
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN) 
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}